

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_skip(CBS *cbs,size_t len)

{
  ulong uVar1;
  
  uVar1 = cbs->len;
  if (len <= uVar1) {
    cbs->data = cbs->data + len;
    cbs->len = uVar1 - len;
  }
  return (uint)(len <= uVar1);
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}